

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeTestGroupToFile(JUnitTestOutput *this)

{
  long *in_RDI;
  undefined1 local_18 [24];
  
  (**(code **)(*in_RDI + 0xb8))(local_18,in_RDI,in_RDI[4] + 0x28);
  (**(code **)(*in_RDI + 0xc0))(in_RDI,local_18);
  SimpleString::~SimpleString((SimpleString *)0x177b51);
  (**(code **)(*in_RDI + 0xe0))();
  (**(code **)(*in_RDI + 0xe8))();
  (**(code **)(*in_RDI + 0xf0))();
  (**(code **)(*in_RDI + 0xf8))();
  (**(code **)(*in_RDI + 0x118))();
  (**(code **)(*in_RDI + 0xd8))();
  return;
}

Assistant:

void JUnitTestOutput::writeTestGroupToFile()
{
    openFileForWrite(createFileName(impl_->results_.group_));
    writeXmlHeader();
    writeTestSuiteSummary();
    writeProperties();
    writeTestCases();
    writeFileEnding();
    closeFile();
}